

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

box3f * __thiscall pbrt::Instance::getBounds(box3f *__return_storage_ptr__,Instance *this)

{
  mutex *__mutex;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  undefined8 uVar10;
  box3f *pbVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  box3f ob;
  box3f local_38;
  
  if (this->haveComputedBounds == true) {
    fVar15 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar15;
    fVar15 = (this->bounds).lower.y;
    uVar10 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar15;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar10;
    return __return_storage_ptr__;
  }
  __mutex = &this->mutex;
  iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar9 == 0) {
    if (this->haveComputedBounds == true) {
      fVar15 = (this->bounds).upper.z;
      (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
      (__return_storage_ptr__->upper).z = fVar15;
      uVar10._0_4_ = (this->bounds).lower.x;
      uVar10._4_4_ = (this->bounds).lower.y;
      uVar12 = *(undefined8 *)&(this->bounds).lower.z;
    }
    else {
      pbVar11 = &local_38;
      (*(((this->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Entity)._vptr_Entity[3])(pbVar11);
      if (((local_38.upper.x < local_38.lower.x) || (local_38.upper.y < local_38.lower.y)) ||
         (local_38.upper.z < local_38.lower.z)) {
        (this->bounds).upper.y = local_38.upper.y;
        (this->bounds).upper.z = local_38.upper.z;
        (this->bounds).lower.x = local_38.lower.x;
        (this->bounds).lower.y = local_38.lower.y;
        *(ulong *)&(this->bounds).lower.z = CONCAT44(local_38.upper.x,local_38.lower.z);
      }
      else {
        fVar15 = (this->xfm).l.vx.z;
        fVar28 = local_38.lower.x * fVar15;
        fVar36 = (this->xfm).l.vy.z;
        fVar23 = local_38.lower.y * fVar36;
        fVar30 = fVar28 + fVar23;
        fVar24 = (this->xfm).l.vz.z;
        fVar18 = local_38.lower.z * fVar24;
        fVar16 = (this->xfm).p.z;
        fVar35 = fVar30 + fVar18 + fVar16;
        fVar19 = fVar35;
        if (3.4028235e+38 <= fVar35) {
          fVar19 = 3.4028235e+38;
        }
        fVar24 = fVar24 * local_38.upper.z;
        fVar31 = fVar30 + fVar24 + fVar16;
        fVar30 = fVar31;
        if (fVar19 <= fVar31) {
          fVar30 = fVar19;
        }
        if (fVar35 <= -3.4028235e+38) {
          fVar35 = -3.4028235e+38;
        }
        if (fVar31 <= fVar35) {
          fVar31 = fVar35;
        }
        fVar36 = fVar36 * local_38.upper.y;
        fVar28 = fVar28 + fVar36;
        fVar35 = fVar18 + fVar28 + fVar16;
        fVar19 = fVar35;
        if (fVar30 <= fVar35) {
          fVar19 = fVar30;
        }
        if (fVar35 <= fVar31) {
          fVar35 = fVar31;
        }
        fVar30 = fVar28 + fVar24 + fVar16;
        fVar28 = fVar30;
        if (fVar19 <= fVar30) {
          fVar28 = fVar19;
        }
        if (fVar30 <= fVar35) {
          fVar30 = fVar35;
        }
        fVar15 = fVar15 * local_38.upper.x;
        fVar23 = fVar23 + fVar15;
        fVar35 = fVar23 + fVar18 + fVar16;
        fVar19 = fVar35;
        if (fVar28 <= fVar35) {
          fVar19 = fVar28;
        }
        if (fVar35 <= fVar30) {
          fVar35 = fVar30;
        }
        fVar28 = fVar23 + fVar24 + fVar16;
        fVar23 = fVar28;
        if (fVar19 <= fVar28) {
          fVar23 = fVar19;
        }
        if (fVar28 <= fVar35) {
          fVar28 = fVar35;
        }
        fVar15 = fVar15 + fVar36;
        fVar19 = fVar18 + fVar15 + fVar16;
        fVar36 = fVar19;
        if (fVar23 <= fVar19) {
          fVar36 = fVar23;
        }
        if (fVar19 <= fVar28) {
          fVar19 = fVar28;
        }
        fVar16 = fVar15 + fVar24 + fVar16;
        fVar15 = fVar16;
        if (fVar36 <= fVar16) {
          fVar15 = fVar36;
        }
        uVar1 = (this->xfm).l.vx.x;
        uVar5 = (this->xfm).l.vx.y;
        uVar2 = (this->xfm).l.vy.x;
        uVar6 = (this->xfm).l.vy.y;
        uVar3 = (this->xfm).l.vz.x;
        uVar7 = (this->xfm).l.vz.y;
        fVar28 = local_38.lower.z * (float)uVar3;
        fVar30 = local_38.lower.z * (float)uVar7;
        fVar35 = local_38.lower.z * 0.0;
        local_38.lower.z = local_38.lower.z * 0.0;
        uVar4 = (this->xfm).p.x;
        uVar8 = (this->xfm).p.y;
        fVar31 = local_38.upper.z * (float)uVar3;
        fVar26 = local_38.upper.z * (float)uVar7;
        fVar27 = local_38.upper.z * 0.0;
        local_38.upper.z = local_38.upper.z * 0.0;
        fVar36 = local_38.lower.x * (float)uVar1 + local_38.lower.y * (float)uVar2;
        fVar24 = local_38.lower.x * (float)uVar5 + local_38.lower.y * (float)uVar6;
        fVar18 = local_38.lower.x * 0.0 + local_38.lower.y * 0.0;
        fVar23 = local_38.lower.x * 0.0 + local_38.lower.y * 0.0;
        auVar37._0_8_ = CONCAT44(fVar24 + fVar30 + (float)uVar8,fVar36 + fVar28 + (float)uVar4);
        auVar37._8_4_ = fVar18 + fVar35 + 0.0;
        auVar37._12_4_ = fVar23 + local_38.lower.z + 0.0;
        auVar40._8_4_ = auVar37._8_4_;
        auVar40._0_8_ = auVar37._0_8_;
        auVar40._12_4_ = auVar37._12_4_;
        auVar41 = minps(auVar40,_DAT_0014c340);
        auVar32._0_8_ = CONCAT44(fVar24 + fVar26 + (float)uVar8,fVar36 + fVar31 + (float)uVar4);
        auVar32._8_4_ = fVar18 + fVar27 + 0.0;
        auVar32._12_4_ = fVar23 + local_38.upper.z + 0.0;
        auVar22._8_4_ = auVar32._8_4_;
        auVar22._0_8_ = auVar32._0_8_;
        auVar22._12_4_ = auVar32._12_4_;
        auVar20 = minps(auVar22,auVar41);
        auVar41 = maxps(auVar37,_DAT_0014c350);
        auVar41 = maxps(auVar32,auVar41);
        fVar36 = local_38.lower.x * (float)uVar1 + local_38.upper.y * (float)uVar2;
        fVar24 = local_38.lower.x * (float)uVar5 + local_38.upper.y * (float)uVar6;
        fVar18 = local_38.lower.x * 0.0 + local_38.upper.y * 0.0;
        fVar23 = local_38.lower.x * 0.0 + local_38.upper.y * 0.0;
        auVar29._0_8_ = CONCAT44(fVar30 + fVar24 + (float)uVar8,fVar28 + fVar36 + (float)uVar4);
        auVar29._8_4_ = fVar35 + fVar18 + 0.0;
        auVar29._12_4_ = local_38.lower.z + fVar23 + 0.0;
        auVar38._8_4_ = auVar29._8_4_;
        auVar38._0_8_ = auVar29._0_8_;
        auVar38._12_4_ = auVar29._12_4_;
        auVar41 = maxps(auVar38,auVar41);
        auVar13._0_8_ = CONCAT44(fVar24 + fVar26 + (float)uVar8,fVar36 + fVar31 + (float)uVar4);
        auVar13._8_4_ = fVar18 + fVar27 + 0.0;
        auVar13._12_4_ = fVar23 + local_38.upper.z + 0.0;
        auVar33._8_4_ = auVar13._8_4_;
        auVar33._0_8_ = auVar13._0_8_;
        auVar33._12_4_ = auVar13._12_4_;
        auVar41 = maxps(auVar33,auVar41);
        fVar36 = local_38.lower.y * (float)uVar2 + local_38.upper.x * (float)uVar1;
        fVar24 = local_38.lower.y * (float)uVar6 + local_38.upper.x * (float)uVar5;
        fVar18 = local_38.lower.y * 0.0 + local_38.upper.x * 0.0;
        fVar23 = local_38.lower.y * 0.0 + local_38.upper.x * 0.0;
        auVar25._0_8_ = CONCAT44(fVar24 + fVar30 + (float)uVar8,fVar36 + fVar28 + (float)uVar4);
        auVar25._8_4_ = fVar18 + fVar35 + 0.0;
        auVar25._12_4_ = fVar23 + local_38.lower.z + 0.0;
        auVar39._8_4_ = auVar25._8_4_;
        auVar39._0_8_ = auVar25._0_8_;
        auVar39._12_4_ = auVar25._12_4_;
        auVar41 = maxps(auVar39,auVar41);
        auVar14._0_8_ = CONCAT44(fVar24 + fVar26 + (float)uVar8,fVar36 + fVar31 + (float)uVar4);
        auVar14._8_4_ = fVar18 + fVar27 + 0.0;
        auVar14._12_4_ = fVar23 + local_38.upper.z + 0.0;
        auVar34._8_4_ = auVar14._8_4_;
        auVar34._0_8_ = auVar14._0_8_;
        auVar34._12_4_ = auVar14._12_4_;
        auVar41 = maxps(auVar34,auVar41);
        fVar36 = local_38.upper.x * (float)uVar1 + local_38.upper.y * (float)uVar2;
        fVar24 = local_38.upper.x * (float)uVar5 + local_38.upper.y * (float)uVar6;
        fVar18 = local_38.upper.x * 0.0 + local_38.upper.y * 0.0;
        fVar23 = local_38.upper.x * 0.0 + local_38.upper.y * 0.0;
        auVar17._0_8_ = CONCAT44(fVar30 + fVar24 + (float)uVar8,fVar28 + fVar36 + (float)uVar4);
        auVar17._8_4_ = fVar35 + fVar18 + 0.0;
        auVar17._12_4_ = local_38.lower.z + fVar23 + 0.0;
        auVar21._8_4_ = auVar17._8_4_;
        auVar21._0_8_ = auVar17._0_8_;
        auVar21._12_4_ = auVar17._12_4_;
        auVar22 = maxps(auVar21,auVar41);
        auVar41._0_8_ = CONCAT44(fVar24 + fVar26 + (float)uVar8,fVar36 + fVar31 + (float)uVar4);
        auVar41._8_4_ = fVar18 + fVar27 + 0.0;
        auVar41._12_4_ = fVar23 + local_38.upper.z + 0.0;
        auVar20 = minps(auVar29,auVar20);
        auVar13 = minps(auVar13,auVar20);
        auVar13 = minps(auVar25,auVar13);
        auVar13 = minps(auVar14,auVar13);
        auVar13 = minps(auVar17,auVar13);
        auVar20._8_4_ = auVar41._8_4_;
        auVar20._0_8_ = auVar41._0_8_;
        auVar20._12_4_ = auVar41._12_4_;
        auVar13 = minps(auVar20,auVar13);
        auVar41 = maxps(auVar41,auVar22);
        if (fVar16 <= fVar19) {
          fVar16 = fVar19;
        }
        (this->bounds).lower.x = (float)(int)auVar13._0_8_;
        (this->bounds).lower.y = (float)(int)((ulong)auVar13._0_8_ >> 0x20);
        (this->bounds).lower.z = fVar15;
        (this->bounds).upper.x = (float)(int)auVar41._0_8_;
        (this->bounds).upper.y = (float)(int)((ulong)auVar41._0_8_ >> 0x20);
        (this->bounds).upper.z = fVar16;
        pbVar11 = &this->bounds;
      }
      this->haveComputedBounds = true;
      fVar15 = (pbVar11->upper).z;
      (__return_storage_ptr__->upper).y = (pbVar11->upper).y;
      (__return_storage_ptr__->upper).z = fVar15;
      uVar10._0_4_ = (pbVar11->lower).x;
      uVar10._4_4_ = (pbVar11->lower).y;
      uVar12 = *(undefined8 *)&(pbVar11->lower).z;
    }
    (__return_storage_ptr__->lower).x = (float)(int)uVar10;
    (__return_storage_ptr__->lower).y = (float)(int)((ulong)uVar10 >> 0x20);
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar12;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  uVar10 = std::__throw_system_error(iVar9);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar10);
}

Assistant:

box3f Instance::getBounds() 
  {
    assert(object);
    
    if (haveComputedBounds) return bounds;

    std::lock_guard<std::mutex> lock(mutex);
    if (haveComputedBounds) return bounds;
    const box3f ob = object->getBounds();
    if (ob.empty()) {
      this->bounds = ob;
      haveComputedBounds = true;
      return ob;
    }

    box3f _bounds = box3f::empty_box();
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    this->bounds = _bounds;
    haveComputedBounds = true;
    return bounds;
  }